

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::noOverlapMergeBAM
          (AlignmentRecord *this,string *dna,string *qualities,string *nucigar,int *c_pos,int *q_pos
          ,int *ref_pos,int i)

{
  char cVar1;
  const_reference pvVar2;
  ShortDnaSequence *this_00;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  size_t in_RDI;
  int *in_R8;
  int *in_R9;
  ShortDnaSequence *s;
  int in_stack_00000010;
  char c;
  char local_31;
  
  if (in_stack_00000010 == 1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),(long)*in_R8);
    local_31 = *pvVar2;
    this_00 = (ShortDnaSequence *)(in_RDI + 0x68);
  }
  else {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xf8),(long)*in_R8);
    local_31 = *pvVar2;
    this_00 = (ShortDnaSequence *)(in_RDI + 0x118);
  }
  if (local_31 == 'H') {
    *(int *)&s->_vptr_ShortDnaSequence = *(int *)&s->_vptr_ShortDnaSequence + 1;
    *in_R8 = *in_R8 + 1;
  }
  else if (local_31 == 'I') {
    cVar1 = ShortDnaSequence::operator[](this_00,in_RDI);
    std::__cxx11::string::operator+=(in_RSI,cVar1);
    cVar1 = ShortDnaSequence::qualityChar(this_00,in_RDI);
    std::__cxx11::string::operator+=(in_RDX,cVar1);
    std::__cxx11::string::operator+=(in_RCX,'I');
    *in_R9 = *in_R9 + 1;
    *in_R8 = *in_R8 + 1;
  }
  else if (local_31 == 'D') {
    std::__cxx11::string::operator+=(in_RCX,'D');
    *(int *)&s->_vptr_ShortDnaSequence = *(int *)&s->_vptr_ShortDnaSequence + 1;
    *in_R8 = *in_R8 + 1;
  }
  else if (local_31 == 'S') {
    *(int *)&s->_vptr_ShortDnaSequence = *(int *)&s->_vptr_ShortDnaSequence + 1;
    *in_R9 = *in_R9 + 1;
    *in_R8 = *in_R8 + 1;
  }
  else if (local_31 == 'M') {
    cVar1 = ShortDnaSequence::operator[](this_00,in_RDI);
    std::__cxx11::string::operator+=(in_RSI,cVar1);
    cVar1 = ShortDnaSequence::qualityChar(this_00,in_RDI);
    std::__cxx11::string::operator+=(in_RDX,cVar1);
    std::__cxx11::string::operator+=(in_RCX,'M');
    *(int *)&s->_vptr_ShortDnaSequence = *(int *)&s->_vptr_ShortDnaSequence + 1;
    *in_R9 = *in_R9 + 1;
    *in_R8 = *in_R8 + 1;
  }
  return;
}

Assistant:

void AlignmentRecord::noOverlapMergeBAM(std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos, int& q_pos, int& ref_pos, int i) const{
    //cout<<"noOverlapMerge"<<endl;
    char c;
    const ShortDnaSequence* s = 0;
    if (i == 1){
        c = this->cigar1_unrolled[c_pos];
        s = &this->sequence1;
    } else {
        c = this->cigar2_unrolled[c_pos];
        s = &this->sequence2;
    }
    if (c == 'H'){
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        nucigar += c;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);

    }
}